

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextUpdateUndocking(ImGuiContext *ctx)

{
  ImGuiID *pIVar1;
  ImGuiDockRequest *pIVar2;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar3;
  ImGuiWindow *window;
  int iVar4;
  ImGuiDockNode *pIVar5;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  long lVar6;
  long lVar7;
  
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    if ((0 < (ctx->DockContext).Nodes.Data.Size) || (0 < (ctx->DockContext).Requests.Size)) {
      DockContextClearNodes(ctx,0,true);
      return;
    }
  }
  else {
    if (((ctx->IO).ConfigDockingNoSplit == true) &&
       (iVar4 = (ctx->DockContext).Nodes.Data.Size, 0 < iVar4)) {
      lVar6 = 8;
      lVar7 = 0;
      do {
        pIVar1 = *(ImGuiID **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar6);
        if (((pIVar1 != (ImGuiID *)0x0) && (*(long *)(pIVar1 + 4) == 0)) &&
           (*(long *)(pIVar1 + 6) != 0)) {
          DockBuilderRemoveNodeChildNodes(*pIVar1);
          iVar4 = (ctx->DockContext).Nodes.Data.Size;
          in_RDX = extraout_RDX;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar7 < iVar4);
    }
    if ((ctx->DockContext).WantFullRebuild == true) {
      DockContextRebuildNodes(ctx);
      (ctx->DockContext).WantFullRebuild = false;
      in_RDX = extraout_RDX_00;
    }
    if (0 < (ctx->DockContext).Requests.Size) {
      lVar6 = 0;
      do {
        pIVar2 = (ctx->DockContext).Requests.Data;
        if (pIVar2[lVar6].Type == ImGuiDockRequestType_Undock) {
          if ((ImGuiContext *)pIVar2[lVar6].UndockTargetWindow == (ImGuiContext *)0x0) {
            src_node = pIVar2[lVar6].UndockTargetNode;
            if (src_node != (ImGuiDockNode *)0x0) {
              if (src_node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
                __assert_fail("node->IsLeafNode()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                              ,0x30a0,
                              "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                             );
              }
              if ((src_node->Windows).Size < 1) {
                __assert_fail("node->Windows.Size >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                              ,0x30a1,
                              "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                             );
              }
              pIVar5 = src_node->ParentNode;
              if ((pIVar5 == (ImGuiDockNode *)0x0) || ((src_node->LocalFlags & 0x800) != 0)) {
                pIVar5 = DockContextAddNode(ctx,0);
                DockNodeMoveWindows(pIVar5,src_node);
                DockSettingsRenameNodeReferences(src_node->ID,pIVar5->ID);
                in_RDX = extraout_RDX_03;
                if (0 < (pIVar5->Windows).Size) {
                  lVar7 = 0;
                  do {
                    window = (pIVar5->Windows).Data[lVar7];
                    UpdateWindowParentAndRootLinks(window,window->Flags,(ImGuiWindow *)0x0);
                    lVar7 = lVar7 + 1;
                    in_RDX = extraout_RDX_04;
                  } while (lVar7 < (pIVar5->Windows).Size);
                }
              }
              else {
                pIVar3 = pIVar5->ChildNodes[0];
                if ((pIVar3 != src_node) && (pIVar5->ChildNodes[1] != src_node)) {
                  __assert_fail("node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                                ,0x30b0,
                                "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                               );
                }
                pIVar5->ChildNodes[pIVar3 != src_node] = (ImGuiDockNode *)0x0;
                DockNodeTreeMerge(ctx,src_node->ParentNode,
                                  src_node->ParentNode->ChildNodes[pIVar3 == src_node]);
                *(ushort *)&src_node->ParentNode->field_0xb8 =
                     (ushort)*(undefined4 *)&src_node->ParentNode->field_0xb8 & 0xfe3f | 0x80;
                src_node->ParentNode = (ImGuiDockNode *)0x0;
                in_RDX = extraout_RDX_02;
                pIVar5 = src_node;
              }
              *(ushort *)&pIVar5->field_0xb8 =
                   (ushort)*(undefined4 *)&pIVar5->field_0xb8 & 0xffc0 | 0x12;
              pIVar5->field_0xba = pIVar5->field_0xba | 1;
              if (GImGui->SettingsDirtyTimer <= 0.0) {
                GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
              }
            }
          }
          else {
            DockContextProcessUndockWindow
                      ((ImGuiContext *)pIVar2[lVar6].UndockTargetWindow,(ImGuiWindow *)0x1,
                       SUB81(in_RDX,0));
            in_RDX = extraout_RDX_01;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (ctx->DockContext).Requests.Size);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}